

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O3

void defyx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  type tVar3;
  type tVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  pointer pMVar10;
  int iVar11;
  long lVar12;
  undefined1 *this;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  RegisterInfo *registers_00;
  SuperscalarInstruction currentInstruction;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  int local_964;
  int local_94c;
  int local_940;
  int local_93c;
  int local_928;
  int local_924;
  SuperscalarInstruction local_918;
  SuperscalarProgram *local_8f0;
  ulong local_8e8;
  SuperscalarInstructionInfo *local_8e0;
  RegisterInfo local_8d8 [8];
  type local_858 [522];
  
  lVar12 = 0;
  local_8f0 = prog;
  memset(local_858,0,0x828);
  do {
    *(undefined8 *)((long)&local_8d8[0].latency + lVar12) = 0xffffffff00000000;
    *(undefined8 *)((long)&local_8d8[0].lastOpPar + lVar12) = 0xffffffff;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x80);
  local_918._34_6_ = uRam00000000001261b2;
  local_918._32_2_ = DAT_001261b0;
  local_918.mod_ = _DAT_001261a0;
  local_918.imm32_ = DAT_001261a0_4;
  local_918.opGroup_ = (SuperscalarInstructionType)uRam00000000001261a8;
  local_918.opGroupPar_ = uRam00000000001261a8._4_4_;
  local_918.info_ = SuperscalarInstruction::Null;
  local_918.src_ = (int)DAT_00126198;
  local_918.dst_ = DAT_00126198._4_4_;
  uVar15 = 0;
  this = DecoderBuffer::Default;
  registers_00 = local_8d8;
  local_940 = 0;
  local_924 = 0;
  iVar17 = 0;
  iVar18 = 0;
  local_964 = 0;
  local_8e8 = 0;
  local_94c = 0;
  uVar14 = 0;
  bVar5 = false;
  local_928 = 0;
  do {
    this = (undefined1 *)
           DecoderBuffer::fetchNext
                     ((DecoderBuffer *)this,(local_918.info_)->type_,(int)local_8e8,local_94c,gen);
    iVar7 = ((DecoderBuffer *)this)->opsCount_;
    if (0 < iVar7) {
      local_93c = 0;
      do {
        pMVar10 = ((local_918.info_)->ops_).
                  super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)((local_918.info_)->ops_).
                                super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10) >> 5) <=
            (int)uVar15) {
          if ((bVar5) || (0x1ff < (int)uVar14)) break;
          SuperscalarInstruction::createForSlot
                    (&local_918,gen,((DecoderBuffer *)this)->counts_[local_93c],
                     ((DecoderBuffer *)this)->index_,iVar7 == local_93c + 1,local_93c == 0);
          pMVar10 = ((local_918.info_)->ops_).
                    super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar15 = 0;
        }
        iVar19 = (int)uVar15;
        iVar7 = iVar18;
        if (iVar18 < iVar17) {
          iVar7 = iVar17;
        }
        if (pMVar10[iVar19].dependent_ == false) {
          iVar7 = iVar17;
        }
        tVar3 = pMVar10[iVar19].uop1_;
        local_8e0 = local_918.info_;
        if (tVar3 != 0) {
          tVar4 = pMVar10[iVar19].uop2_;
          if (tVar4 == 0) {
            iVar7 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,iVar7);
            goto LAB_00112d12;
          }
          iVar13 = iVar7;
          if (iVar7 < 0xae) {
            while( true ) {
              iVar7 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,iVar13);
              iVar8 = scheduleUop<false>(tVar4,(type (*) [174] [3])local_858,iVar13);
              if (iVar7 == iVar8) break;
              iVar13 = iVar13 + 1;
              if (iVar13 == 0xae) goto LAB_0011304b;
            }
            goto LAB_00112d12;
          }
LAB_0011304b:
          uVar9 = (int)local_8e8 + 1;
          goto LAB_0011305d;
        }
LAB_00112d12:
        if (iVar7 < 0) goto LAB_0011304b;
        iVar13 = iVar17;
        if (iVar19 == local_8e0->srcOp_) {
          iVar8 = 0;
          do {
            bVar6 = SuperscalarInstruction::selectSource(&local_918,iVar7,&registers_00,gen);
            if (bVar6) {
              iVar13 = iVar17 - iVar8;
              goto LAB_00112d86;
            }
            iVar7 = iVar7 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != -4);
joined_r0x00112dcd:
          iVar17 = iVar13 + 4;
          if (0xff < local_964) {
            local_918._32_2_ = DAT_001261b0;
            local_918.info_ = SuperscalarInstruction::Null;
            local_918._8_8_ = DAT_00126198;
            local_918._16_8_ = _DAT_001261a0;
            local_918._24_8_ = uRam00000000001261a8;
            break;
          }
          local_964 = local_964 + 1;
          uVar15 = (ulong)((long)((local_918.info_)->ops_).
                                 super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)((local_918.info_)->ops_).
                                super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 5;
        }
        else {
LAB_00112d86:
          iVar8 = iVar7;
          if (iVar19 == (local_918.info_)->dstOp_) {
            iVar11 = 0;
            do {
              bVar6 = SuperscalarInstruction::selectDestination
                                (&local_918,iVar7 + iVar11,0 < local_964,&registers_00,gen);
              iVar8 = iVar7 + iVar11;
              if (bVar6) goto LAB_00112e07;
              iVar11 = iVar11 + 1;
            } while (iVar11 != 4);
            goto joined_r0x00112dcd;
          }
LAB_00112e07:
          tVar3 = pMVar10[iVar19].uop1_;
          if (tVar3 != 0) {
            tVar4 = pMVar10[iVar19].uop2_;
            if (tVar4 == 0) {
              iVar8 = scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,iVar8);
            }
            else {
              iVar18 = iVar8;
              if (iVar8 < 0xae) {
                do {
                  iVar8 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,iVar18);
                  iVar7 = scheduleUop<false>(tVar4,(type (*) [174] [3])local_858,iVar18);
                  if (iVar8 == iVar7) {
                    scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,iVar8);
                    scheduleUop<true>(pMVar10[iVar19].uop2_,(type (*) [174] [3])local_858,iVar8);
                    goto LAB_00112e96;
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 != 0xae);
              }
              iVar8 = -1;
            }
          }
LAB_00112e96:
          iVar18 = pMVar10[iVar19].latency_ + iVar8;
          if (iVar19 == (local_918.info_)->resultOp_) {
            local_8d8[local_918.dst_].latency = iVar18;
            local_8d8[local_918.dst_].lastOpGroup = local_918.opGroup_;
            local_8d8[local_918.dst_].lastOpPar = local_918.opGroupPar_;
            local_928 = iVar18;
          }
          local_940 = local_940 + pMVar10[iVar19].size_;
          local_93c = local_93c + 1;
          uVar15 = (ulong)(iVar19 + 1U);
          local_924 = local_924 + 1;
          if (0xa9 < iVar8) {
            bVar5 = true;
          }
          local_964 = 0;
          if ((int)((ulong)((long)((local_918.info_)->ops_).
                                  super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_918.info_)->ops_).
                                 super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <=
              (int)(iVar19 + 1U)) {
            local_8f0->programBuffer[(int)uVar14].opcode = (char)(local_918.info_)->type_;
            local_8f0->programBuffer[(int)uVar14].dst = (uint8_t)local_918.dst_;
            iVar7 = local_918.src_;
            if (local_918.src_ < 0) {
              iVar7 = local_918.dst_;
            }
            local_8f0->programBuffer[(int)uVar14].src = (uint8_t)iVar7;
            local_8f0->programBuffer[(int)uVar14].mod = (uint8_t)local_918.mod_;
            local_8f0->programBuffer[(int)uVar14].imm32 = local_918.imm32_;
            if ((0xd < (uint)(local_918.info_)->type_) ||
               (iVar7 = 1, (0x3808U >> ((local_918.info_)->type_ & 0x1f) & 1) == 0)) {
              iVar7 = 0;
            }
            uVar14 = uVar14 + 1;
            local_94c = local_94c + iVar7;
          }
        }
        iVar7 = ((DecoderBuffer *)this)->opsCount_;
      } while (local_93c < iVar7);
    }
    uVar9 = (uint)local_8e8 + 1;
    if ((0xa8 < (uint)local_8e8) || (bVar5)) break;
    iVar17 = iVar17 + 1;
    local_8e8 = (ulong)uVar9;
  } while ((int)uVar14 < 0x200);
LAB_0011305d:
  local_8f0->asicLatencies[4] = 0;
  local_8f0->asicLatencies[5] = 0;
  local_8f0->asicLatencies[6] = 0;
  local_8f0->asicLatencies[7] = 0;
  local_8f0->asicLatencies[0] = 0;
  local_8f0->asicLatencies[1] = 0;
  local_8f0->asicLatencies[2] = 0;
  local_8f0->asicLatencies[3] = 0;
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      bVar1 = local_8f0->programBuffer[uVar15].dst;
      bVar2 = local_8f0->programBuffer[uVar15].src;
      iVar17 = 0;
      if (bVar1 != bVar2) {
        iVar17 = local_8f0->asicLatencies[bVar2] + 1;
      }
      iVar18 = local_8f0->asicLatencies[bVar1] + 1;
      if (iVar18 <= iVar17) {
        iVar18 = iVar17;
      }
      local_8f0->asicLatencies[bVar1] = iVar18;
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  uVar16 = 0;
  uVar15 = 0;
  iVar17 = 0;
  do {
    if (iVar17 < local_8f0->asicLatencies[uVar16]) {
      uVar15 = uVar16 & 0xffffffff;
      iVar17 = local_8f0->asicLatencies[uVar16];
    }
    local_8f0->cpuLatencies[uVar16] = ((RegisterInfo *)&registers_00->latency)->latency;
    uVar16 = uVar16 + 1;
    registers_00 = registers_00 + 1;
  } while (uVar16 != 8);
  local_8f0->size = uVar14;
  local_8f0->addrReg = (int)uVar15;
  local_8f0->cpuLatency = local_928;
  local_8f0->asicLatency = iVar17;
  local_8f0->codeSize = local_940;
  local_8f0->macroOps = local_924;
  local_8f0->decodeCycles = uVar9;
  local_8f0->ipc = (double)local_924 / (double)local_928;
  local_8f0->mulCount = local_94c;
  return;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current DefyX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}